

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall
QDockWidgetGroupWindow::eventFilter(QDockWidgetGroupWindow *this,QObject *obj,QEvent *event)

{
  byte bVar1;
  bool bVar2;
  Type TVar3;
  QDockWidget *pQVar4;
  QEvent *in_RDX;
  QEvent *in_RSI;
  QObject *in_RDI;
  QDockWidget *in_stack_00000008;
  QDockWidget *dockWidget;
  bool local_1;
  
  pQVar4 = qobject_cast<QDockWidget*>((QObject *)0x5f250b);
  if (pQVar4 == (QDockWidget *)0x0) {
    bVar1 = QObject::eventFilter(in_RDI,in_RSI);
  }
  else {
    TVar3 = QEvent::type(in_RDX);
    if (TVar3 == Hide) {
      bVar2 = QWidget::isVisible((QWidget *)0x5f257d);
      if (bVar2) {
        QWidget::hide((QWidget *)0x5f258d);
      }
    }
    else if (TVar3 == Close) {
      reparentToMainWindow((QDockWidgetGroupWindow *)dockWidget,in_stack_00000008);
      QDockWidget::setFloating((QDockWidget *)in_RDI,SUB41(TVar3 >> 0x18,0));
    }
    bVar1 = QObject::eventFilter(in_RDI,in_RSI);
  }
  local_1 = (bool)(bVar1 & 1);
  return local_1;
}

Assistant:

bool QDockWidgetGroupWindow::eventFilter(QObject *obj, QEvent *event)
{
    auto *dockWidget = qobject_cast<QDockWidget *>(obj);
    if (!dockWidget)
        return QWidget::eventFilter(obj, event);

    switch (event->type()) {
    case QEvent::Close:
        // We don't want closed dock widgets in a floating tab
        // => dock it to the main dock, before closing;
        reparentToMainWindow(dockWidget);
        dockWidget->setFloating(false);
        break;

    case QEvent::Hide:
        // if the dock widget is not an active tab, it is hidden anyway.
        // if it is the active tab, hide the whole group.
        if (dockWidget->isVisible())
            hide();
        break;

    default:
        break;
    }
    return QWidget::eventFilter(obj, event);
}